

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

size_t el::base::utils::File::getSizeOfFile(fstream_t *fs)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  
  if (fs == (fstream_t *)0x0) {
    sVar1 = 0;
  }
  else {
    auVar2 = ::std::istream::tellg();
    ::std::istream::seekg((long)fs,_S_beg);
    sVar1 = ::std::istream::tellg();
    ::std::istream::seekg(fs,auVar2._0_8_,auVar2._8_8_);
  }
  return sVar1;
}

Assistant:

std::size_t File::getSizeOfFile(base::type::fstream_t* fs) {
  if (fs == nullptr) {
    return 0;
  }
  std::streampos currPos = fs->tellg();
  fs->seekg(0, fs->end);
  std::size_t size = static_cast<std::size_t>(fs->tellg());
  fs->seekg(currPos);
  return size;
}